

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast61_kukakr6r700sixx.cpp
# Opt level: O1

bool __thiscall
IKSolver::ComputeIk(IKSolver *this,IkReal *eetrans,IkReal *eerot,IkReal *pfree,
                   IkSolutionListBase<double> *solutions)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  bool bVar5;
  int ij2;
  long lVar6;
  long lVar7;
  bool bVar8;
  ulong uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  uint uVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  double dVar25;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar30;
  undefined1 auVar31 [16];
  bool j2valid [2];
  bool j0valid [2];
  IkReal j2array [2];
  IkReal j0array [2];
  IkReal sj2array [2];
  IkReal cj2array [2];
  IkReal sj0array [2];
  IkReal cj0array [2];
  ushort local_15c;
  ushort local_15a;
  undefined1 local_158 [16];
  double local_140;
  double local_138;
  undefined8 uStack_130;
  double local_120;
  double local_118;
  undefined8 uStack_110;
  double local_108 [6];
  double local_d8;
  undefined8 uStack_d0;
  double local_c8;
  undefined8 uStack_c0;
  double local_b8;
  undefined8 uStack_b0;
  double local_a8 [4];
  double local_88 [7];
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  this->j0 = NAN;
  this->_ij0[0] = 0xff;
  this->_ij0[1] = 0xff;
  this->_nj0 = 0xff;
  this->j1 = NAN;
  this->_ij1[0] = 0xff;
  this->_ij1[1] = 0xff;
  this->_nj1 = 0xff;
  this->j2 = NAN;
  this->_ij2[0] = 0xff;
  this->_ij2[1] = 0xff;
  this->_nj2 = 0xff;
  this->j3 = NAN;
  this->_ij3[0] = 0xff;
  this->_ij3[1] = 0xff;
  this->_nj3 = 0xff;
  this->j4 = NAN;
  this->_ij4[0] = 0xff;
  this->_ij4[1] = 0xff;
  this->_nj4 = 0xff;
  this->j5 = NAN;
  this->_ij5[0] = 0xff;
  this->_ij5[1] = 0xff;
  this->_nj5 = 0xff;
  (*solutions->_vptr_IkSolutionListBase[5])(solutions);
  dVar19 = *eerot;
  this->r00 = dVar19;
  dVar22 = eerot[1];
  this->r01 = dVar22;
  dVar15 = eerot[2];
  this->r02 = dVar15;
  dVar16 = eerot[3];
  this->r10 = dVar16;
  dVar17 = eerot[4];
  this->r11 = dVar17;
  dVar23 = eerot[5];
  this->r12 = dVar23;
  dVar27 = eerot[6];
  this->r20 = dVar27;
  dVar13 = eerot[7];
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar13;
  this->r21 = dVar13;
  dVar18 = eerot[8];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar18;
  this->r22 = dVar18;
  dVar14 = *eetrans;
  this->px = dVar14;
  dVar21 = eetrans[1];
  this->py = dVar21;
  dVar25 = eetrans[2];
  this->new_r00 = dVar15;
  this->new_r01 = dVar22;
  this->new_r02 = -dVar19;
  this->r02 = -dVar19;
  dVar14 = dVar19 * -0.08 + dVar14;
  this->new_px = dVar14;
  auVar1._8_4_ = SUB84(dVar23,0);
  auVar1._0_8_ = -dVar23;
  auVar1._12_4_ = (uint)((ulong)dVar23 >> 0x20) ^ 0x80000000;
  this->new_r10 = -dVar23;
  this->r10 = (IkReal)auVar1._8_8_;
  auVar2._8_4_ = SUB84(dVar17,0);
  auVar2._0_8_ = -dVar17;
  auVar2._12_4_ = (uint)((ulong)dVar17 >> 0x20) ^ 0x80000000;
  this->new_r11 = -dVar17;
  this->r11 = (IkReal)auVar2._8_8_;
  this->new_r12 = dVar16;
  dVar21 = dVar16 * 0.08 - dVar21;
  this->new_py = dVar21;
  auVar1 = _DAT_00134070;
  auVar28 = auVar28 ^ _DAT_00134070;
  auVar29._0_8_ = auVar28._0_8_;
  auVar29._8_4_ = auVar28._0_4_;
  auVar29._12_4_ = auVar28._4_4_;
  this->new_r20 = auVar29._0_8_;
  this->r20 = (IkReal)auVar29._8_8_;
  auVar24 = auVar24 ^ auVar1;
  auVar31._0_8_ = auVar24._0_8_;
  auVar31._8_4_ = auVar24._0_4_;
  auVar31._12_4_ = auVar24._4_4_;
  this->new_r21 = auVar31._0_8_;
  this->r21 = (IkReal)auVar31._8_8_;
  dVar25 = dVar27 * 0.08 + (0.4 - dVar25);
  this->new_r22 = dVar27;
  this->new_pz = dVar25;
  this->r00 = dVar15;
  this->r01 = dVar22;
  this->r12 = dVar16;
  this->r22 = dVar27;
  this->px = dVar14;
  this->py = dVar21;
  this->pz = dVar25;
  this->pp = dVar25 * dVar25 + dVar14 * dVar14 + dVar21 * dVar21;
  this->npx = (dVar14 * dVar15 - dVar21 * dVar23) - dVar25 * dVar18;
  this->npy = (dVar14 * dVar22 - dVar21 * dVar17) - dVar25 * dVar13;
  this->npz = dVar25 * dVar27 + (dVar16 * dVar21 - dVar14 * dVar19);
  this->rxp0_0 = dVar18 * dVar21 - dVar25 * dVar23;
  this->rxp0_1 = auVar29._0_8_ * dVar14 - dVar25 * dVar15;
  this->rxp0_2 = dVar23 * dVar14 + dVar15 * dVar21;
  this->rxp1_0 = dVar13 * dVar21 - dVar25 * dVar17;
  this->rxp1_1 = auVar31._0_8_ * dVar14 - dVar25 * dVar22;
  this->rxp1_2 = dVar17 * dVar14 + dVar22 * dVar21;
  this->rxp2_0 = dVar25 * dVar16 - dVar21 * dVar27;
  this->rxp2_1 = dVar27 * dVar14 + dVar19 * dVar25;
  this->rxp2_2 = -dVar16 * dVar14 - dVar21 * dVar19;
  if (ABS(ABS(dVar14) + ABS(dVar21)) < 1e-06) goto LAB_00116f60;
  local_15a = 0;
  this->_nj0 = '\x02';
  dVar19 = 0.0;
  uVar10 = 0;
  uVar20 = 0;
  if ((NAN(dVar21) || NAN(-dVar14)) || ((ABS(dVar14) <= 1e-07 && (ABS(dVar21) < 1e-07)))) {
    bVar5 = false;
  }
  else {
    dVar19 = atan2(dVar21,-dVar14);
    bVar5 = true;
    uVar10 = extraout_XMM0_Dc;
    uVar20 = extraout_XMM0_Dd;
  }
  if (!bVar5) goto LAB_00116f60;
  local_108[2] = -dVar19;
  local_158._8_4_ = uVar10;
  local_158._0_8_ = local_108[2];
  local_158._12_4_ = uVar20 ^ 0x80000000;
  local_88[0] = sin(local_108[2]);
  local_88[2] = cos((double)local_158._0_8_);
  local_108[3] = 3.14159265358979 - dVar19;
  local_158._0_8_ = local_108[3];
  local_88[1] = sin(local_108[3]);
  local_88[3] = cos((double)local_158._0_8_);
  if (-3.14159265358979 <= dVar19) {
    if (3.14159265358979 < dVar19) {
      uVar10 = 0x401921fb;
      goto LAB_0011555d;
    }
  }
  else {
    uVar10 = 0xc01921fb;
LAB_0011555d:
    local_108[2] = (double)CONCAT44(uVar10,0x54442d1c) - dVar19;
  }
  if ((double)local_158._0_8_ <= 3.14159265358979) {
    if ((double)local_158._0_8_ < -3.14159265358979) {
      uVar10 = 0x401921fb;
      goto LAB_001155a8;
    }
  }
  else {
    uVar10 = 0xc01921fb;
LAB_001155a8:
    local_108[3] = (double)local_158._0_8_ + (double)CONCAT44(uVar10,0x54442d1c);
  }
  local_15a = 0x101;
  bVar5 = true;
  lVar7 = 0;
  do {
    if (local_158[lVar7 + -2] == '\x01') {
      this->_ij0[0] = (uchar)lVar7;
      this->_ij0[1] = 0xff;
      if ((((lVar7 == 0) && (bVar5)) && (ABS(local_88[2] - local_88[3]) < 1e-06)) &&
         (ABS(local_88[0] - local_88[1]) < 1e-06)) {
        local_15a = local_15a & 0xff;
        this->_ij0[1] = '\x01';
        bVar5 = false;
      }
      this->j0 = local_108[lVar7 + 2];
      dVar19 = local_a8[lVar7 + 6];
      this->cj0 = dVar19;
      dVar22 = local_a8[lVar7 + 4];
      this->sj0 = dVar22;
      local_15c = 0;
      this->_nj2 = '\x02';
      dVar19 = this->pp * -4.328914889538 +
               this->py * 0.2164457444769 * dVar22 +
               dVar19 * 0.2164457444769 * this->px + 1.00885361500683;
      if (ABS(dVar19) <= 1.0000001) {
        dVar19 = IKasin(dVar19);
        local_108[0] = -1.47519820813106 - dVar19;
        local_158._0_8_ = local_108[0];
        local_a8[0] = sin(local_108[0]);
        local_a8[2] = cos((double)local_158._0_8_);
        dVar19 = dVar19 + 1.66639444545874;
        local_108[1] = dVar19;
        local_a8[1] = sin(dVar19);
        local_a8[3] = cos(dVar19);
        if ((double)local_158._0_8_ <= 3.14159265358979) {
          if ((double)local_158._0_8_ < -3.14159265358979) {
            local_108[0] = (double)local_158._0_8_ + 6.28318530717959;
            goto LAB_0011579e;
          }
        }
        else {
          local_108[0] = (double)local_158._0_8_ + -6.28318530717959;
LAB_0011579e:
        }
        uVar10 = 0xc01921fb;
        if ((3.14159265358979 < dVar19) || (uVar10 = 0x401921fb, dVar19 < -3.14159265358979)) {
          local_108[1] = dVar19 + (double)CONCAT44(uVar10,0x54442d1c);
        }
        local_15c = 0x101;
        local_50 = local_a8[3];
        bVar8 = true;
        local_88[6] = local_a8[1];
        lVar6 = 0;
        do {
          if (*(char *)((long)&local_15c + lVar6) != '\x01') goto LAB_00116f33;
          this->_ij2[0] = (uchar)lVar6;
          this->_ij2[1] = 0xff;
          if (((lVar6 == 0) && (bVar8)) &&
             ((ABS(local_a8[2] - local_50) < 1e-06 && (ABS(local_a8[0] - local_88[6]) < 1e-06)))) {
            local_15c = local_15c & 0xff;
            this->_ij2[1] = '\x01';
            bVar8 = false;
          }
          this->j2 = local_108[lVar6];
          dVar19 = local_a8[lVar6 + 2];
          this->cj2 = dVar19;
          dVar22 = local_a8[lVar6];
          this->sj2 = dVar22;
          local_118 = dVar19 * dVar19;
          local_c8 = this->pz;
          dVar23 = dVar19 * local_c8;
          local_38 = this->cj0;
          local_48 = this->px;
          dVar15 = local_38 * local_48;
          local_120 = dVar19 * dVar22;
          local_40 = this->py;
          dVar27 = this->sj0 * local_40;
          local_140 = dVar22 * local_c8;
          local_158._0_8_ = dVar23;
          local_108[5] = dVar22 * 0.365;
          dVar17 = dVar19 * 0.035;
          local_108[4] = dVar17;
          local_b8 = -dVar27;
          uStack_b0 = 0x8000000000000000;
          dVar16 = -dVar15;
          uStack_c0 = 0;
          local_138 = local_c8 * local_c8;
          if (1e-06 <= ABS(dVar22 * 417.142857142857 * dVar27 +
                           ((local_140 * 40.0 +
                            ((dVar23 * 417.142857142857 +
                             dVar22 * -10.4285714285714 +
                             dVar15 * dVar22 * 417.142857142857 + local_c8 * 360.0 + dVar19) -
                            dVar27 * dVar19 * 40.0)) - dVar19 * 40.0 * dVar15))) {
            dVar13 = local_120 * 0.02555 + local_118 * 0.132 + -0.133225 + local_138;
            if (ABS(ABS(local_c8 * -0.025 +
                        dVar22 * 0.114975 +
                        local_118 * -0.02555 + dVar19 * -0.011025 + local_120 * 0.132 + 0.012775 +
                        local_c8 * dVar27 + local_c8 * dVar15) + ABS(dVar13)) < 1e-06)
            goto LAB_00115a98;
            local_d8 = dVar15 * local_108[5];
            uStack_d0 = 0;
            local_88[4] = local_b8 * dVar17;
            dVar18 = local_108[5] * dVar27;
            if (dVar19 * 0.000875 +
                dVar23 * 0.365 +
                local_c8 * 0.315 +
                dVar22 * -0.009125 + local_140 * 0.035 + dVar15 * local_108[5] + local_b8 * dVar17 +
                dVar18 + dVar16 * dVar17 == 0.0) goto LAB_00115a98;
            this->_nj1 = '\x01';
            dVar19 = local_c8 * -0.025 +
                     dVar22 * 0.114975 +
                     dVar19 * -0.011025 +
                     local_120 * 0.132 +
                     local_c8 * dVar15 + local_c8 * dVar27 + local_118 * -0.02555 + 0.012775;
            if ((NAN(dVar13) || NAN(dVar19)) || ((ABS(dVar13) < 1e-07 && (ABS(dVar19) <= 1e-07)))) {
              bVar3 = false;
              dVar19 = -1.5707963267949;
            }
            else {
              local_158._0_8_ = dVar18;
              dVar19 = atan2(dVar13,dVar19);
              dVar19 = dVar19 + -1.5707963267949;
              bVar3 = true;
              dVar18 = (double)local_158._0_8_;
            }
            if (bVar3) {
              dVar22 = this->pz;
              dVar22 = dVar16 * dVar17 +
                       this->cj2 * 0.000875 +
                       this->cj2 * 0.365 * dVar22 +
                       dVar22 * 0.035 * this->sj2 +
                       dVar18 + local_d8 + dVar22 * 0.315 + this->sj2 * -0.009125 + local_88[4];
              uVar9 = -(ulong)(0.0 < dVar22);
              dVar22 = (double)(uVar9 & 0x3ff0000000000000 |
                               ~uVar9 & -(ulong)(dVar22 < 0.0) & 0xbff0000000000000);
              if ((dVar22 == 0.0) && (!NAN(dVar22))) goto LAB_00116f33;
              dVar19 = (1.0 / dVar22) * 1.5707963267949 + dVar19;
              dVar22 = sin(dVar19);
              local_158._0_8_ = dVar22;
              dVar22 = cos(dVar19);
              if (dVar19 <= 3.14159265358979) {
                if (dVar19 < -3.14159265358979) {
                  dVar19 = dVar19 + 6.28318530717959;
                }
              }
              else {
                dVar19 = dVar19 + -6.28318530717959;
              }
              this->_ij1[0] = '\0';
              this->_ij1[1] = 0xff;
              this->j1 = dVar19;
              this->cj1 = dVar22;
              this->sj1 = (IkReal)local_158._0_8_;
              dVar22 = sin(dVar19);
              dVar15 = cos(this->j1);
              dVar16 = this->sj2 * 0.365;
              dVar27 = this->py * this->sj0;
              dVar19 = this->pz;
              dVar23 = this->cj2 * 0.035;
              dVar17 = this->cj0 * this->px;
              if (1e-05 < ABS((((dVar22 * -0.025 + dVar22 * dVar17 + dVar22 * dVar27) - dVar23) +
                              dVar16) - dVar15 * dVar19)) goto LAB_00116f33;
              dVar13 = this->cj2 * 0.365;
              dVar18 = this->sj2 * 0.035;
              if ((((1e-05 < ABS((((dVar15 * 0.025 + (0.315 - dVar27 * dVar15)) - dVar15 * dVar17) +
                                  dVar13 + dVar18) - dVar22 * dVar19)) ||
                   (1e-05 < ABS(-dVar15 * dVar23 +
                                ((dVar15 * dVar16 +
                                 dVar22 * dVar13 + dVar22 * 0.315 + dVar22 * dVar18) - dVar19)))) ||
                  (1e-05 < ABS(dVar19 * 0.63 * dVar22 +
                               dVar15 * dVar17 * 0.63 +
                               dVar17 * 0.05 +
                               dVar27 * 0.05 +
                               ((dVar15 * 0.63 * dVar27 + dVar15 * -0.01575 + 0.0346) - this->pp))))
                 || (1e-05 < ABS(dVar13 * dVar15 +
                                 dVar18 * dVar15 +
                                 ((dVar15 * 0.315 + dVar23 * dVar22 + ((0.025 - dVar27) - dVar17)) -
                                 dVar16 * dVar22)))) goto LAB_00116f33;
LAB_00116f16:
              rotationfunction0(this,solutions);
            }
          }
          else {
LAB_00115a98:
            dVar13 = dVar19 * 0.365;
            local_d8 = dVar19;
            uStack_d0 = 0;
            dVar25 = dVar19 * 0.009125 + 0.007875;
            dVar21 = local_b8 * dVar13;
            dVar18 = dVar15 * -0.315;
            local_88[4] = dVar27;
            local_88[5] = 0.0;
            dVar14 = dVar27 * -0.315;
            if ((ABS(dVar22 * -40.0 * dVar15 +
                     dVar19 * 417.142857142857 * local_b8 +
                     dVar23 * -40.0 +
                     dVar22 * dVar27 * -40.0 +
                     dVar19 * 10.4285714285714 +
                     dVar16 * dVar19 * 417.142857142857 +
                     local_140 * 417.142857142857 + dVar15 * -360.0 + dVar27 * -360.0 + 9.0 + dVar22
                    ) < 1e-06) ||
               (dVar22 * -0.035 * dVar15 +
                dVar22 * 0.000875 +
                local_140 * 0.365 +
                dVar22 * dVar27 * -0.035 + dVar23 * -0.035 + dVar16 * dVar13 + dVar25 + dVar21 +
                dVar18 + dVar14 == 0.0)) {
              local_118 = dVar14;
              uStack_110 = 0;
              local_158._8_8_ = 0x8000000000000000;
              local_158._0_8_ = dVar16;
              local_140 = dVar22;
              dVar23 = local_38 * local_38;
              dVar30 = local_40 * local_40;
              dVar26 = local_48 * local_48 * dVar23;
              if (1e-06 <= ABS((dVar15 * -3200.0 * dVar27 +
                               dVar26 * -1600.0 +
                               local_138 * -1600.0 +
                               dVar27 * 80.0 + dVar15 * 80.0 + dVar23 * dVar30 * 1600.0 + -1.0) -
                               dVar30 * 1600.0)) {
                dVar12 = dVar15 * 0.05 + dVar27 * 0.05 + -0.000625;
                if (((((dVar15 * -2.0 * dVar27 + dVar12) - dVar26) - local_138) - dVar30) +
                    dVar23 * dVar30 != 0.0) {
                  this->_nj1 = '\x01';
                  dVar23 = ((dVar27 * -2.0 * dVar15 + dVar23 * dVar30 + (dVar12 - dVar26)) - dVar30)
                           - local_138;
                  uVar9 = -(ulong)(0.0 < dVar23);
                  dVar23 = (double)(uVar9 & 0x3ff0000000000000 |
                                   ~uVar9 & -(ulong)(dVar23 < 0.0) & 0xbff0000000000000);
                  if ((dVar23 != 0.0) || (NAN(dVar23))) {
                    local_138 = dVar23;
                    uStack_130 = 0;
                    dVar23 = dVar22 * 0.035;
                    dVar16 = dVar19 * 0.000875 +
                             (((local_108[5] * dVar15 +
                               local_c8 * -0.315 +
                               local_b8 * dVar17 +
                               dVar16 * dVar17 + dVar22 * -0.009125 + dVar27 * local_108[5]) -
                              local_c8 * dVar13) - local_c8 * dVar23);
                    dVar19 = (dVar18 + ((dVar14 + dVar22 * 0.000875 +
                                                  local_b8 * dVar23 +
                                                  dVar21 + local_c8 * dVar17 +
                                                           (dVar25 - local_c8 * local_108[5])) -
                                       dVar13 * dVar15)) - dVar23 * dVar15;
                    uVar10 = 0;
                    uVar11 = 0;
                    if ((NAN(dVar16) || NAN(dVar19)) ||
                       ((ABS(dVar19) <= 1e-07 && (ABS(dVar16) < 1e-07)))) {
                      bVar3 = false;
                    }
                    else {
                      dVar19 = atan2(dVar16,dVar19);
                      uVar10 = SUB84(dVar19,0);
                      uVar11 = (undefined4)((ulong)dVar19 >> 0x20);
                      bVar3 = true;
                    }
                    if (bVar3) {
                      local_138 = (double)(~-(ulong)(local_138 != 0.0) & 0x46293e5939a08cea |
                                          (ulong)(1.0 / local_138) & -(ulong)(local_138 != 0.0)) *
                                  1.5707963267949 + -1.5707963267949 +
                                  (double)CONCAT44(uVar11,uVar10);
                      uStack_130 = 0;
                      dVar19 = sin(local_138);
                      dVar22 = cos(local_138);
                      if (local_138 <= 3.14159265358979) {
                        dVar15 = local_138;
                        if (local_138 < -3.14159265358979) {
                          dVar15 = local_138 + 6.28318530717959;
                        }
                      }
                      else {
                        dVar15 = local_138 + -6.28318530717959;
                      }
                      this->_ij1[0] = '\0';
                      this->_ij1[1] = 0xff;
                      this->j1 = dVar15;
                      this->cj1 = dVar22;
                      this->sj1 = dVar19;
                      dVar22 = sin(dVar15);
                      dVar15 = cos(this->j1);
                      dVar27 = this->sj2 * 0.365;
                      dVar16 = this->py * this->sj0;
                      dVar19 = this->pz;
                      dVar23 = this->cj2 * 0.035;
                      dVar17 = this->cj0 * this->px;
                      if (ABS((dVar22 * -0.025 + ((dVar16 * dVar22 + dVar22 * dVar17) - dVar23) +
                              dVar27) - dVar19 * dVar15) <= 1e-05) {
                        dVar13 = this->sj2 * 0.035;
                        dVar18 = this->cj2 * 0.365;
                        if (((ABS((-dVar19 * dVar22 +
                                  dVar15 * 0.025 + (0.315 - dVar16 * dVar15) + dVar13 + dVar18) -
                                  dVar15 * dVar17) <= 1e-05) &&
                            (ABS(dVar22 * dVar13 +
                                 dVar22 * dVar18 +
                                 dVar22 * 0.315 + ((dVar15 * dVar27 - dVar15 * dVar23) - dVar19)) <=
                             1e-05)) &&
                           (ABS(dVar16 * 0.05 +
                                dVar17 * 0.05 +
                                dVar16 * 0.63 * dVar15 +
                                dVar19 * 0.63 * dVar22 +
                                dVar15 * -0.01575 + ((dVar15 * dVar17 * 0.63 + 0.0346) - this->pp))
                            <= 1e-05)) {
                          dVar16 = ((dVar15 * 0.315 +
                                    dVar23 * dVar22 +
                                    dVar13 * dVar15 + dVar18 * dVar15 + (0.025 - dVar27 * dVar22)) -
                                   dVar17) - dVar16;
                          goto joined_r0x00116f14;
                        }
                      }
                    }
                  }
                }
              }
            }
            else {
              dVar18 = dVar18 + dVar14 + dVar22 * 0.000875 +
                                         local_c8 * 0.365 * dVar22 +
                                         ((dVar21 + local_b8 * dVar22 * 0.035 +
                                                    ((dVar19 * -0.035 * local_c8 + dVar25) -
                                                    dVar13 * dVar15)) - dVar22 * 0.035 * dVar15);
              uVar9 = -(ulong)(0.0 < dVar18);
              dVar15 = (double)(uVar9 & 0x3ff0000000000000 |
                               ~uVar9 & -(ulong)(dVar18 < 0.0) & 0xbff0000000000000);
              this->_nj1 = '\x01';
              if ((dVar15 != 0.0) || (NAN(dVar15))) {
                dVar16 = dVar22 * 0.114975 +
                         local_120 * 0.132 +
                         dVar16 * local_c8 +
                         dVar19 * -0.011025 +
                         local_118 * -0.02555 + local_b8 * local_c8 + local_c8 * 0.025 + 0.012775;
                dVar19 = dVar19 * -0.22995 +
                         local_118 * -0.132 +
                         dVar22 * -0.02205 + local_120 * -0.02555 + local_138 + -0.10045;
                uVar10 = 0;
                uVar11 = 0;
                if ((NAN(dVar16) || NAN(dVar19)) ||
                   ((ABS(dVar19) <= 1e-07 && (ABS(dVar16) < 1e-07)))) {
                  bVar3 = false;
                }
                else {
                  dVar19 = atan2(dVar16,dVar19);
                  uVar10 = SUB84(dVar19,0);
                  uVar11 = (undefined4)((ulong)dVar19 >> 0x20);
                  bVar3 = true;
                }
                if (bVar3) {
                  dVar22 = (double)(~-(ulong)(dVar15 != 0.0) & 0x46293e5939a08cea |
                                   (ulong)(1.0 / dVar15) & -(ulong)(dVar15 != 0.0)) *
                           1.5707963267949 + -1.5707963267949 + (double)CONCAT44(uVar11,uVar10);
                  dVar19 = sin(dVar22);
                  local_158._0_8_ = dVar19;
                  dVar19 = cos(dVar22);
                  if (dVar22 <= 3.14159265358979) {
                    if (dVar22 < -3.14159265358979) {
                      dVar22 = dVar22 + 6.28318530717959;
                    }
                  }
                  else {
                    dVar22 = dVar22 + -6.28318530717959;
                  }
                  this->_ij1[0] = '\0';
                  this->_ij1[1] = 0xff;
                  this->j1 = dVar22;
                  this->cj1 = dVar19;
                  this->sj1 = (IkReal)local_158._0_8_;
                  dVar22 = sin(dVar22);
                  dVar15 = cos(this->j1);
                  dVar17 = this->sj2 * 0.365;
                  dVar23 = this->py * this->sj0;
                  dVar19 = this->pz;
                  dVar27 = this->cj2 * 0.035;
                  dVar16 = this->cj0 * this->px;
                  if (ABS((dVar22 * -0.025 + ((dVar22 * dVar16 + dVar22 * dVar23) - dVar27) + dVar17
                          ) - dVar15 * dVar19) <= 1e-05) {
                    dVar13 = this->cj2 * 0.365;
                    dVar18 = this->sj2 * 0.035;
                    if (((ABS(((((dVar15 * 0.025 + 0.315) - dVar23 * dVar15) - dVar22 * dVar19) -
                              dVar15 * dVar16) + dVar13 + dVar18) <= 1e-05) &&
                        (ABS(-dVar15 * dVar27 +
                             dVar22 * 0.315 +
                             dVar22 * dVar13 + dVar15 * dVar17 + (dVar22 * dVar18 - dVar19)) <=
                         1e-05)) &&
                       (ABS(dVar15 * -0.01575 +
                            dVar15 * dVar16 * 0.63 +
                            ((dVar19 * 0.63 * dVar22 +
                             dVar23 * 0.05 + dVar16 * 0.05 + dVar15 * 0.63 * dVar23 + 0.0346) -
                            this->pp)) <= 1e-05)) {
                      dVar16 = dVar13 * dVar15 +
                               dVar15 * 0.315 +
                               ((((dVar18 * dVar15 + dVar27 * dVar22 + 0.025) - dVar17 * dVar22) -
                                dVar23) - dVar16);
joined_r0x00116f14:
                      if (ABS(dVar16) <= 1e-05) goto LAB_00116f16;
                    }
                  }
                }
              }
            }
          }
LAB_00116f33:
          lVar6 = lVar6 + 1;
        } while (lVar6 == 1);
      }
    }
    bVar8 = lVar7 == 0;
    lVar7 = lVar7 + 1;
  } while (bVar8);
LAB_00116f60:
  iVar4 = (*solutions->_vptr_IkSolutionListBase[4])(solutions);
  return CONCAT44(extraout_var,iVar4) != 0;
}

Assistant:

bool ComputeIk(const IkReal* eetrans, const IkReal* eerot, const IkReal* pfree, IkSolutionListBase<IkReal>& solutions) {
j0=numeric_limits<IkReal>::quiet_NaN(); _ij0[0] = -1; _ij0[1] = -1; _nj0 = -1; j1=numeric_limits<IkReal>::quiet_NaN(); _ij1[0] = -1; _ij1[1] = -1; _nj1 = -1; j2=numeric_limits<IkReal>::quiet_NaN(); _ij2[0] = -1; _ij2[1] = -1; _nj2 = -1; j3=numeric_limits<IkReal>::quiet_NaN(); _ij3[0] = -1; _ij3[1] = -1; _nj3 = -1; j4=numeric_limits<IkReal>::quiet_NaN(); _ij4[0] = -1; _ij4[1] = -1; _nj4 = -1; j5=numeric_limits<IkReal>::quiet_NaN(); _ij5[0] = -1; _ij5[1] = -1; _nj5 = -1; 
for(int dummyiter = 0; dummyiter < 1; ++dummyiter) {
    solutions.Clear();
r00 = eerot[0*3+0];
r01 = eerot[0*3+1];
r02 = eerot[0*3+2];
r10 = eerot[1*3+0];
r11 = eerot[1*3+1];
r12 = eerot[1*3+2];
r20 = eerot[2*3+0];
r21 = eerot[2*3+1];
r22 = eerot[2*3+2];
px = eetrans[0]; py = eetrans[1]; pz = eetrans[2];

new_r00=r02;
new_r01=r01;
new_r02=((-1.0)*r00);
new_px=((((-0.08)*r00))+px);
new_r10=((-1.0)*r12);
new_r11=((-1.0)*r11);
new_r12=r10;
new_py=((((-1.0)*py))+(((0.08)*r10)));
new_r20=((-1.0)*r22);
new_r21=((-1.0)*r21);
new_r22=r20;
new_pz=((0.4)+(((-1.0)*pz))+(((0.08)*r20)));
r00 = new_r00; r01 = new_r01; r02 = new_r02; r10 = new_r10; r11 = new_r11; r12 = new_r12; r20 = new_r20; r21 = new_r21; r22 = new_r22; px = new_px; py = new_py; pz = new_pz;
IkReal x54=((1.0)*px);
IkReal x55=((1.0)*pz);
IkReal x56=((1.0)*py);
pp=((px*px)+(py*py)+(pz*pz));
npx=(((px*r00))+((py*r10))+((pz*r20)));
npy=(((px*r01))+((py*r11))+((pz*r21)));
npz=(((px*r02))+((py*r12))+((pz*r22)));
rxp0_0=((((-1.0)*r20*x56))+((pz*r10)));
rxp0_1=(((px*r20))+(((-1.0)*r00*x55)));
rxp0_2=((((-1.0)*r10*x54))+((py*r00)));
rxp1_0=((((-1.0)*r21*x56))+((pz*r11)));
rxp1_1=(((px*r21))+(((-1.0)*r01*x55)));
rxp1_2=((((-1.0)*r11*x54))+((py*r01)));
rxp2_0=(((pz*r12))+(((-1.0)*r22*x56)));
rxp2_1=(((px*r22))+(((-1.0)*r02*x55)));
rxp2_2=((((-1.0)*r12*x54))+((py*r02)));
{
IkReal j0eval[1];
j0eval[0]=((IKabs(px))+(IKabs(py)));
if( IKabs(j0eval[0]) < 0.0000010000000000  )
{
continue; // no branches [j0, j1, j2]

} else
{
{
IkReal j0array[2], cj0array[2], sj0array[2];
bool j0valid[2]={false};
_nj0 = 2;
CheckValue<IkReal> x58 = IKatan2WithCheck(IkReal(py),IkReal(((-1.0)*px)),IKFAST_ATAN2_MAGTHRESH);
if(!x58.valid){
continue;
}
IkReal x57=x58.value;
j0array[0]=((-1.0)*x57);
sj0array[0]=IKsin(j0array[0]);
cj0array[0]=IKcos(j0array[0]);
j0array[1]=((3.14159265358979)+(((-1.0)*x57)));
sj0array[1]=IKsin(j0array[1]);
cj0array[1]=IKcos(j0array[1]);
if( j0array[0] > IKPI )
{
    j0array[0]-=IK2PI;
}
else if( j0array[0] < -IKPI )
{    j0array[0]+=IK2PI;
}
j0valid[0] = true;
if( j0array[1] > IKPI )
{
    j0array[1]-=IK2PI;
}
else if( j0array[1] < -IKPI )
{    j0array[1]+=IK2PI;
}
j0valid[1] = true;
for(int ij0 = 0; ij0 < 2; ++ij0)
{
if( !j0valid[ij0] )
{
    continue;
}
_ij0[0] = ij0; _ij0[1] = -1;
for(int iij0 = ij0+1; iij0 < 2; ++iij0)
{
if( j0valid[iij0] && IKabs(cj0array[ij0]-cj0array[iij0]) < IKFAST_SOLUTION_THRESH && IKabs(sj0array[ij0]-sj0array[iij0]) < IKFAST_SOLUTION_THRESH )
{
    j0valid[iij0]=false; _ij0[1] = iij0; break; 
}
}
j0 = j0array[ij0]; cj0 = cj0array[ij0]; sj0 = sj0array[ij0];

{
IkReal j2array[2], cj2array[2], sj2array[2];
bool j2valid[2]={false};
_nj2 = 2;
if( (((1.00885361500683)+(((0.2164457444769)*cj0*px))+(((0.2164457444769)*py*sj0))+(((-4.328914889538)*pp)))) < -1-IKFAST_SINCOS_THRESH || (((1.00885361500683)+(((0.2164457444769)*cj0*px))+(((0.2164457444769)*py*sj0))+(((-4.328914889538)*pp)))) > 1+IKFAST_SINCOS_THRESH )
    continue;
IkReal x59=IKasin(((1.00885361500683)+(((0.2164457444769)*cj0*px))+(((0.2164457444769)*py*sj0))+(((-4.328914889538)*pp))));
j2array[0]=((-1.47519820813106)+(((-1.0)*x59)));
sj2array[0]=IKsin(j2array[0]);
cj2array[0]=IKcos(j2array[0]);
j2array[1]=((1.66639444545874)+x59);
sj2array[1]=IKsin(j2array[1]);
cj2array[1]=IKcos(j2array[1]);
if( j2array[0] > IKPI )
{
    j2array[0]-=IK2PI;
}
else if( j2array[0] < -IKPI )
{    j2array[0]+=IK2PI;
}
j2valid[0] = true;
if( j2array[1] > IKPI )
{
    j2array[1]-=IK2PI;
}
else if( j2array[1] < -IKPI )
{    j2array[1]+=IK2PI;
}
j2valid[1] = true;
for(int ij2 = 0; ij2 < 2; ++ij2)
{
if( !j2valid[ij2] )
{
    continue;
}
_ij2[0] = ij2; _ij2[1] = -1;
for(int iij2 = ij2+1; iij2 < 2; ++iij2)
{
if( j2valid[iij2] && IKabs(cj2array[ij2]-cj2array[iij2]) < IKFAST_SOLUTION_THRESH && IKabs(sj2array[ij2]-sj2array[iij2]) < IKFAST_SOLUTION_THRESH )
{
    j2valid[iij2]=false; _ij2[1] = iij2; break; 
}
}
j2 = j2array[ij2]; cj2 = cj2array[ij2]; sj2 = sj2array[ij2];

{
IkReal j1eval[3];
IkReal x60=cj2*cj2;
IkReal x61=(cj2*pz);
IkReal x62=(cj0*px);
IkReal x63=(cj2*sj2);
IkReal x64=((0.365)*sj2);
IkReal x65=(py*sj0);
IkReal x66=((0.035)*cj2);
IkReal x67=((417.142857142857)*sj2);
IkReal x68=(pz*sj2);
IkReal x69=((40.0)*cj2);
j1eval[0]=((((360.0)*pz))+cj2+((x62*x67))+(((-10.4285714285714)*sj2))+(((417.142857142857)*x61))+(((-1.0)*x65*x69))+(((40.0)*x68))+(((-1.0)*x62*x69))+((x65*x67)));
j1eval[1]=((IKabs(((0.012775)+(((0.132)*x63))+(((-0.011025)*cj2))+(((-0.02555)*x60))+((pz*x65))+((pz*x62))+(((0.114975)*sj2))+(((-0.025)*pz)))))+(IKabs(((-0.133225)+(((0.132)*x60))+(pz*pz)+(((0.02555)*x63))))));
j1eval[2]=IKsign(((((-0.009125)*sj2))+(((0.035)*x68))+((x62*x64))+(((-1.0)*x65*x66))+(((0.315)*pz))+(((0.365)*x61))+((x64*x65))+(((0.000875)*cj2))+(((-1.0)*x62*x66))));
if( IKabs(j1eval[0]) < 0.0000010000000000  || IKabs(j1eval[1]) < 0.0000010000000000  || IKabs(j1eval[2]) < 0.0000010000000000  )
{
{
IkReal j1eval[2];
IkReal x70=(cj0*px);
IkReal x71=(pz*sj2);
IkReal x72=(cj2*pz);
IkReal x73=(py*sj0);
IkReal x74=((417.142857142857)*cj2);
IkReal x75=((0.365)*cj2);
IkReal x76=(sj2*x73);
j1eval[0]=((9.0)+(((-360.0)*x73))+(((-360.0)*x70))+(((417.142857142857)*x71))+sj2+(((-1.0)*x70*x74))+(((10.4285714285714)*cj2))+(((-40.0)*x76))+(((-40.0)*x72))+(((-1.0)*x73*x74))+(((-40.0)*sj2*x70)));
j1eval[1]=IKsign(((0.007875)+(((0.009125)*cj2))+(((-1.0)*x70*x75))+(((-0.035)*x72))+(((-0.035)*x76))+(((0.365)*x71))+(((0.000875)*sj2))+(((-1.0)*x73*x75))+(((-0.315)*x70))+(((-0.315)*x73))+(((-0.035)*sj2*x70))));
if( IKabs(j1eval[0]) < 0.0000010000000000  || IKabs(j1eval[1]) < 0.0000010000000000  )
{
{
IkReal j1eval[2];
IkReal x77=cj0*cj0;
IkReal x78=py*py;
IkReal x79=px*px;
IkReal x80=pz*pz;
IkReal x81=(cj0*px);
IkReal x82=(py*sj0);
IkReal x83=((1600.0)*x78);
IkReal x84=(x77*x79);
j1eval[0]=((-1.0)+((x77*x83))+(((80.0)*x81))+(((80.0)*x82))+(((-1600.0)*x80))+(((-1600.0)*x84))+(((-3200.0)*x81*x82))+(((-1.0)*x83)));
j1eval[1]=IKsign(((-0.000625)+(((0.05)*x82))+(((0.05)*x81))+(((-2.0)*x81*x82))+(((-1.0)*x84))+(((-1.0)*x80))+(((-1.0)*x78))+((x77*x78))));
if( IKabs(j1eval[0]) < 0.0000010000000000  || IKabs(j1eval[1]) < 0.0000010000000000  )
{
continue; // no branches [j1]

} else
{
{
IkReal j1array[1], cj1array[1], sj1array[1];
bool j1valid[1]={false};
_nj1 = 1;
IkReal x85=py*py;
IkReal x86=cj0*cj0;
IkReal x87=(py*sj0);
IkReal x88=((0.365)*cj2);
IkReal x89=((0.035)*sj2);
IkReal x90=((0.365)*sj2);
IkReal x91=(cj0*px);
IkReal x92=((0.035)*cj2);
CheckValue<IkReal> x93=IKPowWithIntegerCheck(IKsign(((-0.000625)+(((0.05)*x87))+(((0.05)*x91))+(((-1.0)*x86*(px*px)))+((x85*x86))+(((-2.0)*x87*x91))+(((-1.0)*x85))+(((-1.0)*(pz*pz))))),-1);
if(!x93.valid){
continue;
}
CheckValue<IkReal> x94 = IKatan2WithCheck(IkReal(((((-0.009125)*sj2))+((x87*x90))+(((-1.0)*x91*x92))+(((-1.0)*x87*x92))+(((-0.315)*pz))+((x90*x91))+(((-1.0)*pz*x88))+(((-1.0)*pz*x89))+(((0.000875)*cj2)))),IkReal(((0.007875)+(((0.009125)*cj2))+(((-1.0)*pz*x90))+((pz*x92))+(((-1.0)*x87*x88))+(((-1.0)*x87*x89))+(((0.000875)*sj2))+(((-0.315)*x87))+(((-1.0)*x88*x91))+(((-0.315)*x91))+(((-1.0)*x89*x91)))),IKFAST_ATAN2_MAGTHRESH);
if(!x94.valid){
continue;
}
j1array[0]=((-1.5707963267949)+(((1.5707963267949)*(x93.value)))+(x94.value));
sj1array[0]=IKsin(j1array[0]);
cj1array[0]=IKcos(j1array[0]);
if( j1array[0] > IKPI )
{
    j1array[0]-=IK2PI;
}
else if( j1array[0] < -IKPI )
{    j1array[0]+=IK2PI;
}
j1valid[0] = true;
for(int ij1 = 0; ij1 < 1; ++ij1)
{
if( !j1valid[ij1] )
{
    continue;
}
_ij1[0] = ij1; _ij1[1] = -1;
for(int iij1 = ij1+1; iij1 < 1; ++iij1)
{
if( j1valid[iij1] && IKabs(cj1array[ij1]-cj1array[iij1]) < IKFAST_SOLUTION_THRESH && IKabs(sj1array[ij1]-sj1array[iij1]) < IKFAST_SOLUTION_THRESH )
{
    j1valid[iij1]=false; _ij1[1] = iij1; break; 
}
}
j1 = j1array[ij1]; cj1 = cj1array[ij1]; sj1 = sj1array[ij1];
{
IkReal evalcond[5];
IkReal x95=IKsin(j1);
IkReal x96=IKcos(j1);
IkReal x97=((0.365)*cj2);
IkReal x98=((0.035)*sj2);
IkReal x99=((0.365)*sj2);
IkReal x100=(py*sj0);
IkReal x101=((1.0)*pz);
IkReal x102=((0.035)*cj2);
IkReal x103=(cj0*px);
IkReal x104=((1.0)*x96);
IkReal x105=(x103*x96);
evalcond[0]=(((x100*x95))+((x103*x95))+(((-1.0)*x102))+(((-0.025)*x95))+x99+(((-1.0)*x101*x96)));
evalcond[1]=((0.315)+(((-1.0)*x100*x104))+(((0.025)*x96))+x98+x97+(((-1.0)*x101*x95))+(((-1.0)*x103*x104)));
evalcond[2]=(((x96*x99))+(((-1.0)*x102*x96))+(((-1.0)*x101))+(((0.315)*x95))+((x95*x97))+((x95*x98)));
evalcond[3]=((0.0346)+(((0.63)*x105))+(((-1.0)*pp))+(((-0.01575)*x96))+(((0.63)*pz*x95))+(((0.63)*x100*x96))+(((0.05)*x103))+(((0.05)*x100)));
evalcond[4]=((0.025)+(((-1.0)*x95*x99))+((x96*x97))+((x96*x98))+((x102*x95))+(((0.315)*x96))+(((-1.0)*x103))+(((-1.0)*x100)));
if( IKabs(evalcond[0]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[1]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[2]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[3]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[4]) > IKFAST_EVALCOND_THRESH  )
{
continue;
}
}

rotationfunction0(solutions);
}
}

}

}

} else
{
{
IkReal j1array[1], cj1array[1], sj1array[1];
bool j1valid[1]={false};
_nj1 = 1;
IkReal x608=cj2*cj2;
IkReal x609=(py*sj0);
IkReal x610=((0.365)*cj2);
IkReal x611=((0.035)*sj2);
IkReal x612=(cj2*sj2);
IkReal x613=(cj0*px);
IkReal x614=((1.0)*pz);
CheckValue<IkReal> x615=IKPowWithIntegerCheck(IKsign(((0.007875)+(((0.009125)*cj2))+(((-0.035)*cj2*pz))+(((-1.0)*x610*x613))+(((-1.0)*x609*x611))+(((-1.0)*x609*x610))+(((-1.0)*x611*x613))+(((0.365)*pz*sj2))+(((0.000875)*sj2))+(((-0.315)*x609))+(((-0.315)*x613)))),-1);
if(!x615.valid){
continue;
}
CheckValue<IkReal> x616 = IKatan2WithCheck(IkReal(((0.012775)+(((0.025)*pz))+(((-1.0)*x609*x614))+(((-0.02555)*x608))+(((-0.011025)*cj2))+(((-1.0)*x613*x614))+(((0.132)*x612))+(((0.114975)*sj2)))),IkReal(((-0.10045)+(pz*pz)+(((-0.02555)*x612))+(((-0.02205)*sj2))+(((-0.132)*x608))+(((-0.22995)*cj2)))),IKFAST_ATAN2_MAGTHRESH);
if(!x616.valid){
continue;
}
j1array[0]=((-1.5707963267949)+(((1.5707963267949)*(x615.value)))+(x616.value));
sj1array[0]=IKsin(j1array[0]);
cj1array[0]=IKcos(j1array[0]);
if( j1array[0] > IKPI )
{
    j1array[0]-=IK2PI;
}
else if( j1array[0] < -IKPI )
{    j1array[0]+=IK2PI;
}
j1valid[0] = true;
for(int ij1 = 0; ij1 < 1; ++ij1)
{
if( !j1valid[ij1] )
{
    continue;
}
_ij1[0] = ij1; _ij1[1] = -1;
for(int iij1 = ij1+1; iij1 < 1; ++iij1)
{
if( j1valid[iij1] && IKabs(cj1array[ij1]-cj1array[iij1]) < IKFAST_SOLUTION_THRESH && IKabs(sj1array[ij1]-sj1array[iij1]) < IKFAST_SOLUTION_THRESH )
{
    j1valid[iij1]=false; _ij1[1] = iij1; break; 
}
}
j1 = j1array[ij1]; cj1 = cj1array[ij1]; sj1 = sj1array[ij1];
{
IkReal evalcond[5];
IkReal x617=IKsin(j1);
IkReal x618=IKcos(j1);
IkReal x619=((0.365)*cj2);
IkReal x620=((0.035)*sj2);
IkReal x621=((0.365)*sj2);
IkReal x622=(py*sj0);
IkReal x623=((1.0)*pz);
IkReal x624=((0.035)*cj2);
IkReal x625=(cj0*px);
IkReal x626=((1.0)*x618);
IkReal x627=(x618*x625);
evalcond[0]=(((x617*x625))+((x617*x622))+(((-1.0)*x624))+(((-0.025)*x617))+x621+(((-1.0)*x618*x623)));
evalcond[1]=((0.315)+(((0.025)*x618))+(((-1.0)*x622*x626))+(((-1.0)*x617*x623))+(((-1.0)*x625*x626))+x619+x620);
evalcond[2]=(((x617*x620))+(((-1.0)*x623))+((x618*x621))+((x617*x619))+(((0.315)*x617))+(((-1.0)*x618*x624)));
evalcond[3]=((0.0346)+(((0.63)*x618*x622))+(((0.05)*x625))+(((0.05)*x622))+(((0.63)*pz*x617))+(((-1.0)*pp))+(((0.63)*x627))+(((-0.01575)*x618)));
evalcond[4]=((0.025)+((x617*x624))+((x618*x620))+(((-1.0)*x617*x621))+(((-1.0)*x622))+(((-1.0)*x625))+(((0.315)*x618))+((x618*x619)));
if( IKabs(evalcond[0]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[1]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[2]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[3]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[4]) > IKFAST_EVALCOND_THRESH  )
{
continue;
}
}

rotationfunction0(solutions);
}
}

}

}

} else
{
{
IkReal j1array[1], cj1array[1], sj1array[1];
bool j1valid[1]={false};
_nj1 = 1;
IkReal x628=cj2*cj2;
IkReal x629=(cj2*sj2);
IkReal x630=((0.365)*sj2);
IkReal x631=(py*sj0);
IkReal x632=(cj0*px);
IkReal x633=((0.035)*cj2);
CheckValue<IkReal> x634 = IKatan2WithCheck(IkReal(((-0.133225)+(((0.132)*x628))+(pz*pz)+(((0.02555)*x629)))),IkReal(((0.012775)+(((-0.02555)*x628))+((pz*x631))+((pz*x632))+(((0.132)*x629))+(((-0.011025)*cj2))+(((0.114975)*sj2))+(((-0.025)*pz)))),IKFAST_ATAN2_MAGTHRESH);
if(!x634.valid){
continue;
}
CheckValue<IkReal> x635=IKPowWithIntegerCheck(IKsign(((((-0.009125)*sj2))+(((-1.0)*x631*x633))+(((0.315)*pz))+((x630*x632))+((x630*x631))+(((0.035)*pz*sj2))+(((0.365)*cj2*pz))+(((0.000875)*cj2))+(((-1.0)*x632*x633)))),-1);
if(!x635.valid){
continue;
}
j1array[0]=((-1.5707963267949)+(x634.value)+(((1.5707963267949)*(x635.value))));
sj1array[0]=IKsin(j1array[0]);
cj1array[0]=IKcos(j1array[0]);
if( j1array[0] > IKPI )
{
    j1array[0]-=IK2PI;
}
else if( j1array[0] < -IKPI )
{    j1array[0]+=IK2PI;
}
j1valid[0] = true;
for(int ij1 = 0; ij1 < 1; ++ij1)
{
if( !j1valid[ij1] )
{
    continue;
}
_ij1[0] = ij1; _ij1[1] = -1;
for(int iij1 = ij1+1; iij1 < 1; ++iij1)
{
if( j1valid[iij1] && IKabs(cj1array[ij1]-cj1array[iij1]) < IKFAST_SOLUTION_THRESH && IKabs(sj1array[ij1]-sj1array[iij1]) < IKFAST_SOLUTION_THRESH )
{
    j1valid[iij1]=false; _ij1[1] = iij1; break; 
}
}
j1 = j1array[ij1]; cj1 = cj1array[ij1]; sj1 = sj1array[ij1];
{
IkReal evalcond[5];
IkReal x636=IKsin(j1);
IkReal x637=IKcos(j1);
IkReal x638=((0.365)*cj2);
IkReal x639=((0.035)*sj2);
IkReal x640=((0.365)*sj2);
IkReal x641=(py*sj0);
IkReal x642=((1.0)*pz);
IkReal x643=((0.035)*cj2);
IkReal x644=(cj0*px);
IkReal x645=((1.0)*x637);
IkReal x646=(x637*x644);
evalcond[0]=(((x636*x644))+((x636*x641))+(((-0.025)*x636))+(((-1.0)*x643))+x640+(((-1.0)*x637*x642)));
evalcond[1]=((0.315)+(((-1.0)*x641*x645))+(((0.025)*x637))+(((-1.0)*x644*x645))+x638+x639+(((-1.0)*x636*x642)));
evalcond[2]=((((0.315)*x636))+((x636*x639))+((x636*x638))+((x637*x640))+(((-1.0)*x642))+(((-1.0)*x637*x643)));
evalcond[3]=((0.0346)+(((-0.01575)*x637))+(((0.63)*x637*x641))+(((-1.0)*pp))+(((0.05)*x641))+(((0.05)*x644))+(((0.63)*x646))+(((0.63)*pz*x636)));
evalcond[4]=((0.025)+(((-1.0)*x641))+(((-1.0)*x644))+((x636*x643))+(((0.315)*x637))+(((-1.0)*x636*x640))+((x637*x639))+((x637*x638)));
if( IKabs(evalcond[0]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[1]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[2]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[3]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[4]) > IKFAST_EVALCOND_THRESH  )
{
continue;
}
}

rotationfunction0(solutions);
}
}

}

}
}
}
}
}

}

}
}
return solutions.GetNumSolutions()>0;
}